

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int delta_encode_cost(int *colors,int num,int bit_depth,int min_val)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i_1;
  int range;
  int bits_per_delta;
  int delta;
  int i;
  int min_bits;
  int deltas [8];
  int max_delta;
  int bits_cost;
  int local_6c;
  int local_64;
  int local_60;
  int local_58;
  int local_50;
  int aiStack_48 [9];
  int local_24;
  int local_20;
  int local_14;
  long local_10;
  int local_4;
  
  if (in_ESI < 1) {
    local_4 = 0;
  }
  else {
    local_4 = in_EDX;
    if (in_ESI != 1) {
      local_20 = in_EDX + 2;
      local_24 = 0;
      local_64 = in_EDX + -3;
      local_14 = in_ESI;
      local_10 = in_RDI;
      for (local_50 = 1; local_50 < local_14; local_50 = local_50 + 1) {
        iVar1 = *(int *)(local_10 + (long)local_50 * 4) -
                *(int *)(local_10 + (long)(local_50 + -1) * 4);
        aiStack_48[local_50 + -1] = iVar1;
        if (local_24 < iVar1) {
          local_24 = iVar1;
        }
      }
      iVar1 = av1_ceil_log2(0x28032a);
      if (local_64 < iVar1) {
        local_64 = av1_ceil_log2(0x280340);
      }
      local_58 = local_64;
      for (local_60 = 0; local_60 < local_14 + -1; local_60 = local_60 + 1) {
        local_20 = local_58 + local_20;
        iVar1 = av1_ceil_log2(0x2803b7);
        if (local_58 < iVar1) {
          local_6c = local_58;
        }
        else {
          local_6c = av1_ceil_log2(0x2803d4);
        }
        local_58 = local_6c;
      }
      local_4 = local_20;
    }
  }
  return local_4;
}

Assistant:

static int delta_encode_cost(const int *colors, int num, int bit_depth,
                             int min_val) {
  if (num <= 0) return 0;
  int bits_cost = bit_depth;
  if (num == 1) return bits_cost;
  bits_cost += 2;
  int max_delta = 0;
  int deltas[PALETTE_MAX_SIZE];
  const int min_bits = bit_depth - 3;
  for (int i = 1; i < num; ++i) {
    const int delta = colors[i] - colors[i - 1];
    deltas[i - 1] = delta;
    assert(delta >= min_val);
    if (delta > max_delta) max_delta = delta;
  }
  int bits_per_delta = AOMMAX(av1_ceil_log2(max_delta + 1 - min_val), min_bits);
  assert(bits_per_delta <= bit_depth);
  int range = (1 << bit_depth) - colors[0] - min_val;
  for (int i = 0; i < num - 1; ++i) {
    bits_cost += bits_per_delta;
    range -= deltas[i];
    bits_per_delta = AOMMIN(bits_per_delta, av1_ceil_log2(range));
  }
  return bits_cost;
}